

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.hpp
# Opt level: O0

int __thiscall io::posix::mmap_file::open(mmap_file *this,char *__file,int __oflag,...)

{
  error_code *peVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int *piVar3;
  value_type *__file_00;
  error_category *peVar4;
  __off_t size_00;
  uint in_ECX;
  error_code *in_R8;
  undefined1 local_58 [8];
  mmap_handle mmap;
  offset_type size;
  file_descriptor_handle new_fd;
  int raw_fd;
  error_code *ec_local;
  perms create_perms_local;
  open_mode mode_local;
  path *path_local;
  mmap_file *this_local;
  
  unique0x100001e0 = in_R8;
  std::error_code::clear(in_R8);
  piVar3 = __errno_location();
  *piVar3 = 0;
  __file_00 = std::filesystem::__cxx11::path::c_str((path *)__file);
  iVar2 = detail::open_mode_to_posix_mode(__oflag);
  new_fd.fd_ = ::open(__file_00,iVar2,(ulong)in_ECX);
  peVar1 = stack0xffffffffffffffd8;
  if (new_fd.fd_ < 0) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    peVar4 = (error_category *)std::_V2::system_category();
    std::error_code::assign(peVar1,iVar2,peVar4);
    iVar2 = extraout_EAX;
  }
  else {
    file_descriptor_handle::file_descriptor_handle
              ((file_descriptor_handle *)((long)&size + 4),new_fd.fd_,true);
    iVar2 = file_descriptor_handle::get((file_descriptor_handle *)((long)&size + 4));
    size_00 = lseek(iVar2,0,2);
    peVar1 = stack0xffffffffffffffd8;
    if (size_00 == -1) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      peVar4 = (error_category *)std::_V2::system_category();
      std::error_code::assign(peVar1,iVar2,peVar4);
      mmap.size_._4_4_ = 1;
    }
    else {
      detail::mmap_handle::create
                ((mmap_handle *)local_58,(file_descriptor_handle *)((long)&size + 4),size_00,__oflag
                 ,stack0xffffffffffffffd8);
      mmap.size_._4_1_ = std::error_code::operator_cast_to_bool(stack0xffffffffffffffd8);
      if (!mmap.size_._4_1_) {
        detail::mmap_handle::operator=(&this->mmap_,(mmap_handle *)local_58);
      }
      mmap.size_._5_3_ = 0;
      detail::mmap_handle::~mmap_handle((mmap_handle *)local_58);
    }
    file_descriptor_handle::~file_descriptor_handle((file_descriptor_handle *)((long)&size + 4));
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void open(const io_std::filesystem::path& path,
              open_mode mode,
              io_std::filesystem::perms create_perms,
              std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;

        // First, try to open the file
        int raw_fd = ::open(path.c_str(), detail::open_mode_to_posix_mode(mode),
                            static_cast<::mode_t>(create_perms));
        if (raw_fd < 0) {
            ec.assign(errno, std::system_category());
            return;
        }
        file_descriptor_handle new_fd{raw_fd};

        // Now seek to the end to find the file size
        offset_type size = ::lseek(new_fd.get(), 0, SEEK_END);
        if (size == -1) {
            ec.assign(errno, std::system_category());
            return;
        }

        auto mmap = detail::mmap_handle::create(new_fd, size, mode, ec);
        if (ec) {
            return;
        }

        this->mmap_ = std::move(mmap);
    }